

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

size_t bitset_count(bitset_t *bitset)

{
  ulong uVar1;
  uint64_t *puVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  ushort uVar7;
  byte bVar23;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  char cVar24;
  byte bVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  byte bVar31;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  char cVar32;
  byte bVar55;
  char cVar56;
  byte bVar57;
  char cVar58;
  byte bVar59;
  char cVar60;
  byte bVar61;
  char cVar62;
  byte bVar63;
  undefined1 auVar37 [12];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar39 [12];
  undefined1 auVar51 [16];
  undefined1 auVar40 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  char cVar64;
  byte bVar79;
  char cVar80;
  byte bVar81;
  char cVar82;
  byte bVar83;
  char cVar84;
  byte bVar85;
  char cVar86;
  byte bVar87;
  undefined1 auVar69 [12];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  char cVar88;
  byte bVar101;
  char cVar102;
  byte bVar103;
  char cVar104;
  byte bVar105;
  char cVar106;
  byte bVar107;
  char cVar108;
  byte bVar109;
  undefined1 auVar93 [12];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined4 uVar8;
  undefined6 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  ushort uVar33;
  undefined4 uVar34;
  undefined6 uVar35;
  undefined8 uVar36;
  undefined1 auVar38 [12];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  ushort uVar65;
  undefined4 uVar66;
  undefined6 uVar67;
  undefined8 uVar68;
  undefined1 auVar70 [12];
  undefined1 auVar71 [14];
  undefined1 auVar72 [14];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  ushort uVar89;
  undefined4 uVar90;
  undefined6 uVar91;
  undefined8 uVar92;
  undefined1 auVar94 [12];
  undefined1 auVar95 [14];
  undefined1 auVar96 [14];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  
  uVar1 = bitset->arraysize;
  sVar3 = 0;
  for (uVar4 = 0; uVar4 + 7 < uVar1; uVar4 = uVar4 + 8) {
    puVar2 = bitset->array;
    auVar77 = *(undefined1 (*) [16])(puVar2 + uVar4);
    auVar19 = *(undefined1 (*) [16])(puVar2 + uVar4 + 2);
    auVar111 = *(undefined1 (*) [16])(puVar2 + uVar4 + 4);
    auVar46 = *(undefined1 (*) [16])(puVar2 + uVar4 + 6);
    auVar110._0_2_ = auVar111._0_2_ >> 1;
    auVar110._2_2_ = auVar111._2_2_ >> 1;
    auVar110._4_2_ = auVar111._4_2_ >> 1;
    auVar110._6_2_ = auVar111._6_2_ >> 1;
    auVar110._8_2_ = auVar111._8_2_ >> 1;
    auVar110._10_2_ = auVar111._10_2_ >> 1;
    auVar110._12_2_ = auVar111._12_2_ >> 1;
    auVar110._14_2_ = auVar111._14_2_ >> 1;
    auVar110 = auVar110 & _DAT_0012c1c0;
    uVar7 = CONCAT11(auVar111[1] - auVar110[1],auVar111[0] - auVar110[0]);
    uVar8 = CONCAT13(auVar111[3] - auVar110[3],CONCAT12(auVar111[2] - auVar110[2],uVar7));
    uVar9 = CONCAT15(auVar111[5] - auVar110[5],CONCAT14(auVar111[4] - auVar110[4],uVar8));
    uVar10 = CONCAT17(auVar111[7] - auVar110[7],CONCAT16(auVar111[6] - auVar110[6],uVar9));
    auVar69._0_10_ = CONCAT19(auVar111[9] - auVar110[9],CONCAT18(auVar111[8] - auVar110[8],uVar10));
    auVar69[10] = auVar111[10] - auVar110[10];
    auVar69[0xb] = auVar111[0xb] - auVar110[0xb];
    auVar71[0xc] = auVar111[0xc] - auVar110[0xc];
    auVar71._0_12_ = auVar69;
    auVar71[0xd] = auVar111[0xd] - auVar110[0xd];
    auVar73[0xe] = auVar111[0xe] - auVar110[0xe];
    auVar73._0_14_ = auVar71;
    auVar73[0xf] = auVar111[0xf] - auVar110[0xf];
    auVar111 = auVar73 & _DAT_0012c1d0;
    auVar74._0_2_ = uVar7 >> 2;
    auVar74._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar74._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar74._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar74._8_2_ = (ushort)((unkuint10)auVar69._0_10_ >> 0x42);
    auVar74._10_2_ = auVar69._10_2_ >> 2;
    auVar74._12_2_ = auVar71._12_2_ >> 2;
    auVar74._14_2_ = auVar73._14_2_ >> 2;
    auVar74 = auVar74 & _DAT_0012c1d0;
    cVar64 = auVar74[0] + auVar111[0];
    bVar79 = auVar74[1] + auVar111[1];
    uVar65 = CONCAT11(bVar79,cVar64);
    cVar80 = auVar74[2] + auVar111[2];
    bVar81 = auVar74[3] + auVar111[3];
    uVar66 = CONCAT13(bVar81,CONCAT12(cVar80,uVar65));
    cVar82 = auVar74[4] + auVar111[4];
    bVar83 = auVar74[5] + auVar111[5];
    uVar67 = CONCAT15(bVar83,CONCAT14(cVar82,uVar66));
    cVar84 = auVar74[6] + auVar111[6];
    bVar85 = auVar74[7] + auVar111[7];
    uVar68 = CONCAT17(bVar85,CONCAT16(cVar84,uVar67));
    cVar86 = auVar74[8] + auVar111[8];
    bVar87 = auVar74[9] + auVar111[9];
    auVar70._0_10_ = CONCAT19(bVar87,CONCAT18(cVar86,uVar68));
    auVar70[10] = auVar74[10] + auVar111[10];
    auVar70[0xb] = auVar74[0xb] + auVar111[0xb];
    auVar72[0xc] = auVar74[0xc] + auVar111[0xc];
    auVar72._0_12_ = auVar70;
    auVar72[0xd] = auVar74[0xd] + auVar111[0xd];
    auVar75[0xe] = auVar74[0xe] + auVar111[0xe];
    auVar75._0_14_ = auVar72;
    auVar75[0xf] = auVar74[0xf] + auVar111[0xf];
    auVar76._0_2_ = auVar77._0_2_ >> 1;
    auVar76._2_2_ = auVar77._2_2_ >> 1;
    auVar76._4_2_ = auVar77._4_2_ >> 1;
    auVar76._6_2_ = auVar77._6_2_ >> 1;
    auVar76._8_2_ = auVar77._8_2_ >> 1;
    auVar76._10_2_ = auVar77._10_2_ >> 1;
    auVar76._12_2_ = auVar77._12_2_ >> 1;
    auVar76._14_2_ = auVar77._14_2_ >> 1;
    auVar76 = auVar76 & _DAT_0012c1c0;
    uVar7 = CONCAT11(auVar77[1] - auVar76[1],auVar77[0] - auVar76[0]);
    uVar8 = CONCAT13(auVar77[3] - auVar76[3],CONCAT12(auVar77[2] - auVar76[2],uVar7));
    uVar9 = CONCAT15(auVar77[5] - auVar76[5],CONCAT14(auVar77[4] - auVar76[4],uVar8));
    uVar10 = CONCAT17(auVar77[7] - auVar76[7],CONCAT16(auVar77[6] - auVar76[6],uVar9));
    auVar93._0_10_ = CONCAT19(auVar77[9] - auVar76[9],CONCAT18(auVar77[8] - auVar76[8],uVar10));
    auVar93[10] = auVar77[10] - auVar76[10];
    auVar93[0xb] = auVar77[0xb] - auVar76[0xb];
    auVar95[0xc] = auVar77[0xc] - auVar76[0xc];
    auVar95._0_12_ = auVar93;
    auVar95[0xd] = auVar77[0xd] - auVar76[0xd];
    auVar97[0xe] = auVar77[0xe] - auVar76[0xe];
    auVar97._0_14_ = auVar95;
    auVar97[0xf] = auVar77[0xf] - auVar76[0xf];
    auVar77 = auVar97 & _DAT_0012c1d0;
    auVar98._0_2_ = uVar7 >> 2;
    auVar98._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar98._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar98._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar98._8_2_ = (ushort)((unkuint10)auVar93._0_10_ >> 0x42);
    auVar98._10_2_ = auVar93._10_2_ >> 2;
    auVar98._12_2_ = auVar95._12_2_ >> 2;
    auVar98._14_2_ = auVar97._14_2_ >> 2;
    auVar98 = auVar98 & _DAT_0012c1d0;
    cVar88 = auVar98[0] + auVar77[0];
    bVar101 = auVar98[1] + auVar77[1];
    uVar89 = CONCAT11(bVar101,cVar88);
    cVar102 = auVar98[2] + auVar77[2];
    bVar103 = auVar98[3] + auVar77[3];
    uVar90 = CONCAT13(bVar103,CONCAT12(cVar102,uVar89));
    cVar104 = auVar98[4] + auVar77[4];
    bVar105 = auVar98[5] + auVar77[5];
    uVar91 = CONCAT15(bVar105,CONCAT14(cVar104,uVar90));
    cVar106 = auVar98[6] + auVar77[6];
    bVar107 = auVar98[7] + auVar77[7];
    uVar92 = CONCAT17(bVar107,CONCAT16(cVar106,uVar91));
    cVar108 = auVar98[8] + auVar77[8];
    bVar109 = auVar98[9] + auVar77[9];
    auVar94._0_10_ = CONCAT19(bVar109,CONCAT18(cVar108,uVar92));
    auVar94[10] = auVar98[10] + auVar77[10];
    auVar94[0xb] = auVar98[0xb] + auVar77[0xb];
    auVar96[0xc] = auVar98[0xc] + auVar77[0xc];
    auVar96._0_12_ = auVar94;
    auVar96[0xd] = auVar98[0xd] + auVar77[0xd];
    auVar99[0xe] = auVar98[0xe] + auVar77[0xe];
    auVar99._0_14_ = auVar96;
    auVar99[0xf] = auVar98[0xf] + auVar77[0xf];
    auVar100._0_2_ = auVar46._0_2_ >> 1;
    auVar100._2_2_ = auVar46._2_2_ >> 1;
    auVar100._4_2_ = auVar46._4_2_ >> 1;
    auVar100._6_2_ = auVar46._6_2_ >> 1;
    auVar100._8_2_ = auVar46._8_2_ >> 1;
    auVar100._10_2_ = auVar46._10_2_ >> 1;
    auVar100._12_2_ = auVar46._12_2_ >> 1;
    auVar100._14_2_ = auVar46._14_2_ >> 1;
    auVar100 = auVar100 & _DAT_0012c1c0;
    uVar7 = CONCAT11(auVar46[1] - auVar100[1],auVar46[0] - auVar100[0]);
    uVar8 = CONCAT13(auVar46[3] - auVar100[3],CONCAT12(auVar46[2] - auVar100[2],uVar7));
    uVar9 = CONCAT15(auVar46[5] - auVar100[5],CONCAT14(auVar46[4] - auVar100[4],uVar8));
    uVar10 = CONCAT17(auVar46[7] - auVar100[7],CONCAT16(auVar46[6] - auVar100[6],uVar9));
    auVar37._0_10_ = CONCAT19(auVar46[9] - auVar100[9],CONCAT18(auVar46[8] - auVar100[8],uVar10));
    auVar37[10] = auVar46[10] - auVar100[10];
    auVar37[0xb] = auVar46[0xb] - auVar100[0xb];
    auVar41[0xc] = auVar46[0xc] - auVar100[0xc];
    auVar41._0_12_ = auVar37;
    auVar41[0xd] = auVar46[0xd] - auVar100[0xd];
    auVar45[0xe] = auVar46[0xe] - auVar100[0xe];
    auVar45._0_14_ = auVar41;
    auVar45[0xf] = auVar46[0xf] - auVar100[0xf];
    auVar77 = auVar45 & _DAT_0012c1d0;
    auVar46._0_2_ = uVar7 >> 2;
    auVar46._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar46._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar46._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar46._8_2_ = (ushort)((unkuint10)auVar37._0_10_ >> 0x42);
    auVar46._10_2_ = auVar37._10_2_ >> 2;
    auVar46._12_2_ = auVar41._12_2_ >> 2;
    auVar46._14_2_ = auVar45._14_2_ >> 2;
    auVar46 = auVar46 & _DAT_0012c1d0;
    cVar32 = auVar46[0] + auVar77[0];
    bVar55 = auVar46[1] + auVar77[1];
    uVar33 = CONCAT11(bVar55,cVar32);
    cVar56 = auVar46[2] + auVar77[2];
    bVar57 = auVar46[3] + auVar77[3];
    uVar34 = CONCAT13(bVar57,CONCAT12(cVar56,uVar33));
    cVar58 = auVar46[4] + auVar77[4];
    bVar59 = auVar46[5] + auVar77[5];
    uVar35 = CONCAT15(bVar59,CONCAT14(cVar58,uVar34));
    cVar60 = auVar46[6] + auVar77[6];
    bVar61 = auVar46[7] + auVar77[7];
    uVar36 = CONCAT17(bVar61,CONCAT16(cVar60,uVar35));
    cVar62 = auVar46[8] + auVar77[8];
    bVar63 = auVar46[9] + auVar77[9];
    auVar38._0_10_ = CONCAT19(bVar63,CONCAT18(cVar62,uVar36));
    auVar38[10] = auVar46[10] + auVar77[10];
    auVar38[0xb] = auVar46[0xb] + auVar77[0xb];
    auVar42[0xc] = auVar46[0xc] + auVar77[0xc];
    auVar42._0_12_ = auVar38;
    auVar42[0xd] = auVar46[0xd] + auVar77[0xd];
    auVar47[0xe] = auVar46[0xe] + auVar77[0xe];
    auVar47._0_14_ = auVar42;
    auVar47[0xf] = auVar46[0xf] + auVar77[0xf];
    auVar48._0_2_ = auVar19._0_2_ >> 1;
    auVar48._2_2_ = auVar19._2_2_ >> 1;
    auVar48._4_2_ = auVar19._4_2_ >> 1;
    auVar48._6_2_ = auVar19._6_2_ >> 1;
    auVar48._8_2_ = auVar19._8_2_ >> 1;
    auVar48._10_2_ = auVar19._10_2_ >> 1;
    auVar48._12_2_ = auVar19._12_2_ >> 1;
    auVar48._14_2_ = auVar19._14_2_ >> 1;
    auVar48 = auVar48 & _DAT_0012c1c0;
    uVar7 = CONCAT11(auVar19[1] - auVar48[1],auVar19[0] - auVar48[0]);
    uVar8 = CONCAT13(auVar19[3] - auVar48[3],CONCAT12(auVar19[2] - auVar48[2],uVar7));
    uVar9 = CONCAT15(auVar19[5] - auVar48[5],CONCAT14(auVar19[4] - auVar48[4],uVar8));
    uVar10 = CONCAT17(auVar19[7] - auVar48[7],CONCAT16(auVar19[6] - auVar48[6],uVar9));
    auVar11._0_10_ = CONCAT19(auVar19[9] - auVar48[9],CONCAT18(auVar19[8] - auVar48[8],uVar10));
    auVar11[10] = auVar19[10] - auVar48[10];
    auVar11[0xb] = auVar19[0xb] - auVar48[0xb];
    auVar15[0xc] = auVar19[0xc] - auVar48[0xc];
    auVar15._0_12_ = auVar11;
    auVar15[0xd] = auVar19[0xd] - auVar48[0xd];
    auVar77[0xe] = auVar19[0xe] - auVar48[0xe];
    auVar77._0_14_ = auVar15;
    auVar77[0xf] = auVar19[0xf] - auVar48[0xf];
    auVar46 = auVar77 & _DAT_0012c1d0;
    auVar19._0_2_ = uVar7 >> 2;
    auVar19._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar19._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar19._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar19._8_2_ = (ushort)((unkuint10)auVar11._0_10_ >> 0x42);
    auVar19._10_2_ = auVar11._10_2_ >> 2;
    auVar19._12_2_ = auVar15._12_2_ >> 2;
    auVar19._14_2_ = auVar77._14_2_ >> 2;
    auVar19 = auVar19 & _DAT_0012c1d0;
    cVar6 = auVar19[0] + auVar46[0];
    bVar23 = auVar19[1] + auVar46[1];
    uVar7 = CONCAT11(bVar23,cVar6);
    cVar24 = auVar19[2] + auVar46[2];
    bVar25 = auVar19[3] + auVar46[3];
    uVar8 = CONCAT13(bVar25,CONCAT12(cVar24,uVar7));
    cVar26 = auVar19[4] + auVar46[4];
    bVar27 = auVar19[5] + auVar46[5];
    uVar9 = CONCAT15(bVar27,CONCAT14(cVar26,uVar8));
    cVar28 = auVar19[6] + auVar46[6];
    bVar29 = auVar19[7] + auVar46[7];
    uVar10 = CONCAT17(bVar29,CONCAT16(cVar28,uVar9));
    cVar30 = auVar19[8] + auVar46[8];
    bVar31 = auVar19[9] + auVar46[9];
    auVar12._0_10_ = CONCAT19(bVar31,CONCAT18(cVar30,uVar10));
    auVar12[10] = auVar19[10] + auVar46[10];
    auVar12[0xb] = auVar19[0xb] + auVar46[0xb];
    auVar16[0xc] = auVar19[0xc] + auVar46[0xc];
    auVar16._0_12_ = auVar12;
    auVar16[0xd] = auVar19[0xd] + auVar46[0xd];
    auVar111[0xe] = auVar19[0xe] + auVar46[0xe];
    auVar111._0_14_ = auVar16;
    auVar111[0xf] = auVar19[0xf] + auVar46[0xf];
    auVar49[0] = ((char)(uVar7 >> 4) + cVar6 & 0xfU) + ((char)(uVar33 >> 4) + cVar32 & 0xfU) +
                 ((char)(uVar89 >> 4) + cVar88 & 0xfU) + ((char)(uVar65 >> 4) + cVar64 & 0xfU);
    auVar49[1] = ((bVar23 >> 4) + bVar23 & 0xf) + ((bVar55 >> 4) + bVar55 & 0xf) +
                 ((bVar101 >> 4) + bVar101 & 0xf) + ((bVar79 >> 4) + bVar79 & 0xf);
    auVar49[2] = ((char)(ushort)((uint)uVar8 >> 0x14) + cVar24 & 0xfU) +
                 ((char)(ushort)((uint)uVar34 >> 0x14) + cVar56 & 0xfU) +
                 ((char)(ushort)((uint)uVar90 >> 0x14) + cVar102 & 0xfU) +
                 ((char)(ushort)((uint)uVar66 >> 0x14) + cVar80 & 0xfU);
    auVar49[3] = ((bVar25 >> 4) + bVar25 & 0xf) + ((bVar57 >> 4) + bVar57 & 0xf) +
                 ((bVar103 >> 4) + bVar103 & 0xf) + ((bVar81 >> 4) + bVar81 & 0xf);
    auVar49[4] = ((char)(ushort)((uint6)uVar9 >> 0x24) + cVar26 & 0xfU) +
                 ((char)(ushort)((uint6)uVar35 >> 0x24) + cVar58 & 0xfU) +
                 ((char)(ushort)((uint6)uVar91 >> 0x24) + cVar104 & 0xfU) +
                 ((char)(ushort)((uint6)uVar67 >> 0x24) + cVar82 & 0xfU);
    auVar49[5] = ((bVar27 >> 4) + bVar27 & 0xf) + ((bVar59 >> 4) + bVar59 & 0xf) +
                 ((bVar105 >> 4) + bVar105 & 0xf) + ((bVar83 >> 4) + bVar83 & 0xf);
    auVar49[6] = ((char)(ushort)((ulong)uVar10 >> 0x34) + cVar28 & 0xfU) +
                 ((char)(ushort)((ulong)uVar36 >> 0x34) + cVar60 & 0xfU) +
                 ((char)(ushort)((ulong)uVar92 >> 0x34) + cVar106 & 0xfU) +
                 ((char)(ushort)((ulong)uVar68 >> 0x34) + cVar84 & 0xfU);
    auVar49[7] = ((bVar29 >> 4) + bVar29 & 0xf) + ((bVar61 >> 4) + bVar61 & 0xf) +
                 ((bVar107 >> 4) + bVar107 & 0xf) + ((bVar85 >> 4) + bVar85 & 0xf);
    auVar49[8] = ((char)(ushort)((unkuint10)auVar12._0_10_ >> 0x44) + cVar30 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar38._0_10_ >> 0x44) + cVar62 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar94._0_10_ >> 0x44) + cVar108 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar70._0_10_ >> 0x44) + cVar86 & 0xfU);
    auVar49[9] = ((bVar31 >> 4) + bVar31 & 0xf) + ((bVar63 >> 4) + bVar63 & 0xf) +
                 ((bVar109 >> 4) + bVar109 & 0xf) + ((bVar87 >> 4) + bVar87 & 0xf);
    auVar49[10] = ((char)(auVar12._10_2_ >> 4) + auVar12[10] & 0xfU) +
                  ((char)(auVar38._10_2_ >> 4) + auVar38[10] & 0xfU) +
                  ((char)(auVar94._10_2_ >> 4) + auVar94[10] & 0xfU) +
                  ((char)(auVar70._10_2_ >> 4) + auVar70[10] & 0xfU);
    auVar49[0xb] = ((auVar12[0xb] >> 4) + auVar12[0xb] & 0xf) +
                   ((auVar38[0xb] >> 4) + auVar38[0xb] & 0xf) +
                   ((auVar94[0xb] >> 4) + auVar94[0xb] & 0xf) +
                   ((auVar70[0xb] >> 4) + auVar70[0xb] & 0xf);
    auVar49[0xc] = ((char)(auVar16._12_2_ >> 4) + auVar16[0xc] & 0xfU) +
                   ((char)(auVar42._12_2_ >> 4) + auVar42[0xc] & 0xfU) +
                   ((char)(auVar96._12_2_ >> 4) + auVar96[0xc] & 0xfU) +
                   ((char)(auVar72._12_2_ >> 4) + auVar72[0xc] & 0xfU);
    auVar49[0xd] = ((auVar16[0xd] >> 4) + auVar16[0xd] & 0xf) +
                   ((auVar42[0xd] >> 4) + auVar42[0xd] & 0xf) +
                   ((auVar96[0xd] >> 4) + auVar96[0xd] & 0xf) +
                   ((auVar72[0xd] >> 4) + auVar72[0xd] & 0xf);
    auVar49[0xe] = ((char)(auVar111._14_2_ >> 4) + auVar111[0xe] & 0xfU) +
                   ((char)(auVar47._14_2_ >> 4) + auVar47[0xe] & 0xfU) +
                   ((char)(auVar99._14_2_ >> 4) + auVar99[0xe] & 0xfU) +
                   ((char)(auVar75._14_2_ >> 4) + auVar75[0xe] & 0xfU);
    auVar49[0xf] = ((auVar111[0xf] >> 4) + auVar111[0xf] & 0xf) +
                   ((auVar47[0xf] >> 4) + auVar47[0xf] & 0xf) +
                   ((auVar99[0xf] >> 4) + auVar99[0xf] & 0xf) +
                   ((auVar75[0xf] >> 4) + auVar75[0xf] & 0xf);
    auVar77 = psadbw(auVar49,(undefined1  [16])0x0);
    sVar3 = sVar3 + auVar77._8_8_ + auVar77._0_8_;
  }
  for (; uVar4 + 3 < uVar1; uVar4 = uVar4 + 4) {
    auVar77 = *(undefined1 (*) [16])(bitset->array + uVar4);
    auVar19 = *(undefined1 (*) [16])(bitset->array + uVar4 + 2);
    auVar78._0_2_ = auVar19._0_2_ >> 1;
    auVar78._2_2_ = auVar19._2_2_ >> 1;
    auVar78._4_2_ = auVar19._4_2_ >> 1;
    auVar78._6_2_ = auVar19._6_2_ >> 1;
    auVar78._8_2_ = auVar19._8_2_ >> 1;
    auVar78._10_2_ = auVar19._10_2_ >> 1;
    auVar78._12_2_ = auVar19._12_2_ >> 1;
    auVar78._14_2_ = auVar19._14_2_ >> 1;
    auVar78 = auVar78 & _DAT_0012c1c0;
    uVar7 = CONCAT11(auVar19[1] - auVar78[1],auVar19[0] - auVar78[0]);
    uVar8 = CONCAT13(auVar19[3] - auVar78[3],CONCAT12(auVar19[2] - auVar78[2],uVar7));
    uVar9 = CONCAT15(auVar19[5] - auVar78[5],CONCAT14(auVar19[4] - auVar78[4],uVar8));
    uVar10 = CONCAT17(auVar19[7] - auVar78[7],CONCAT16(auVar19[6] - auVar78[6],uVar9));
    auVar39._0_10_ = CONCAT19(auVar19[9] - auVar78[9],CONCAT18(auVar19[8] - auVar78[8],uVar10));
    auVar39[10] = auVar19[10] - auVar78[10];
    auVar39[0xb] = auVar19[0xb] - auVar78[0xb];
    auVar43[0xc] = auVar19[0xc] - auVar78[0xc];
    auVar43._0_12_ = auVar39;
    auVar43[0xd] = auVar19[0xd] - auVar78[0xd];
    auVar50[0xe] = auVar19[0xe] - auVar78[0xe];
    auVar50._0_14_ = auVar43;
    auVar50[0xf] = auVar19[0xf] - auVar78[0xf];
    auVar19 = auVar50 & _DAT_0012c1d0;
    auVar51._0_2_ = uVar7 >> 2;
    auVar51._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar51._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar51._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar51._8_2_ = (ushort)((unkuint10)auVar39._0_10_ >> 0x42);
    auVar51._10_2_ = auVar39._10_2_ >> 2;
    auVar51._12_2_ = auVar43._12_2_ >> 2;
    auVar51._14_2_ = auVar50._14_2_ >> 2;
    auVar51 = auVar51 & _DAT_0012c1d0;
    cVar32 = auVar51[0] + auVar19[0];
    bVar55 = auVar51[1] + auVar19[1];
    uVar33 = CONCAT11(bVar55,cVar32);
    cVar56 = auVar51[2] + auVar19[2];
    bVar57 = auVar51[3] + auVar19[3];
    uVar34 = CONCAT13(bVar57,CONCAT12(cVar56,uVar33));
    cVar58 = auVar51[4] + auVar19[4];
    bVar59 = auVar51[5] + auVar19[5];
    uVar35 = CONCAT15(bVar59,CONCAT14(cVar58,uVar34));
    cVar60 = auVar51[6] + auVar19[6];
    bVar61 = auVar51[7] + auVar19[7];
    uVar36 = CONCAT17(bVar61,CONCAT16(cVar60,uVar35));
    cVar62 = auVar51[8] + auVar19[8];
    bVar63 = auVar51[9] + auVar19[9];
    auVar40._0_10_ = CONCAT19(bVar63,CONCAT18(cVar62,uVar36));
    auVar40[10] = auVar51[10] + auVar19[10];
    auVar40[0xb] = auVar51[0xb] + auVar19[0xb];
    auVar44[0xc] = auVar51[0xc] + auVar19[0xc];
    auVar44._0_12_ = auVar40;
    auVar44[0xd] = auVar51[0xd] + auVar19[0xd];
    auVar52[0xe] = auVar51[0xe] + auVar19[0xe];
    auVar52._0_14_ = auVar44;
    auVar52[0xf] = auVar51[0xf] + auVar19[0xf];
    auVar53._0_2_ = auVar77._0_2_ >> 1;
    auVar53._2_2_ = auVar77._2_2_ >> 1;
    auVar53._4_2_ = auVar77._4_2_ >> 1;
    auVar53._6_2_ = auVar77._6_2_ >> 1;
    auVar53._8_2_ = auVar77._8_2_ >> 1;
    auVar53._10_2_ = auVar77._10_2_ >> 1;
    auVar53._12_2_ = auVar77._12_2_ >> 1;
    auVar53._14_2_ = auVar77._14_2_ >> 1;
    auVar53 = auVar53 & _DAT_0012c1c0;
    uVar7 = CONCAT11(auVar77[1] - auVar53[1],auVar77[0] - auVar53[0]);
    uVar8 = CONCAT13(auVar77[3] - auVar53[3],CONCAT12(auVar77[2] - auVar53[2],uVar7));
    uVar9 = CONCAT15(auVar77[5] - auVar53[5],CONCAT14(auVar77[4] - auVar53[4],uVar8));
    uVar10 = CONCAT17(auVar77[7] - auVar53[7],CONCAT16(auVar77[6] - auVar53[6],uVar9));
    auVar13._0_10_ = CONCAT19(auVar77[9] - auVar53[9],CONCAT18(auVar77[8] - auVar53[8],uVar10));
    auVar13[10] = auVar77[10] - auVar53[10];
    auVar13[0xb] = auVar77[0xb] - auVar53[0xb];
    auVar17[0xc] = auVar77[0xc] - auVar53[0xc];
    auVar17._0_12_ = auVar13;
    auVar17[0xd] = auVar77[0xd] - auVar53[0xd];
    auVar20[0xe] = auVar77[0xe] - auVar53[0xe];
    auVar20._0_14_ = auVar17;
    auVar20[0xf] = auVar77[0xf] - auVar53[0xf];
    auVar77 = auVar20 & _DAT_0012c1d0;
    auVar21._0_2_ = uVar7 >> 2;
    auVar21._2_2_ = (ushort)((uint)uVar8 >> 0x12);
    auVar21._4_2_ = (ushort)((uint6)uVar9 >> 0x22);
    auVar21._6_2_ = (ushort)((ulong)uVar10 >> 0x32);
    auVar21._8_2_ = (ushort)((unkuint10)auVar13._0_10_ >> 0x42);
    auVar21._10_2_ = auVar13._10_2_ >> 2;
    auVar21._12_2_ = auVar17._12_2_ >> 2;
    auVar21._14_2_ = auVar20._14_2_ >> 2;
    auVar21 = auVar21 & _DAT_0012c1d0;
    cVar6 = auVar21[0] + auVar77[0];
    bVar23 = auVar21[1] + auVar77[1];
    uVar7 = CONCAT11(bVar23,cVar6);
    cVar24 = auVar21[2] + auVar77[2];
    bVar25 = auVar21[3] + auVar77[3];
    uVar8 = CONCAT13(bVar25,CONCAT12(cVar24,uVar7));
    cVar26 = auVar21[4] + auVar77[4];
    bVar27 = auVar21[5] + auVar77[5];
    uVar9 = CONCAT15(bVar27,CONCAT14(cVar26,uVar8));
    cVar28 = auVar21[6] + auVar77[6];
    bVar29 = auVar21[7] + auVar77[7];
    uVar10 = CONCAT17(bVar29,CONCAT16(cVar28,uVar9));
    cVar30 = auVar21[8] + auVar77[8];
    bVar31 = auVar21[9] + auVar77[9];
    auVar14._0_10_ = CONCAT19(bVar31,CONCAT18(cVar30,uVar10));
    auVar14[10] = auVar21[10] + auVar77[10];
    auVar14[0xb] = auVar21[0xb] + auVar77[0xb];
    auVar18[0xc] = auVar21[0xc] + auVar77[0xc];
    auVar18._0_12_ = auVar14;
    auVar18[0xd] = auVar21[0xd] + auVar77[0xd];
    auVar22[0xe] = auVar21[0xe] + auVar77[0xe];
    auVar22._0_14_ = auVar18;
    auVar22[0xf] = auVar21[0xf] + auVar77[0xf];
    auVar54[0] = ((char)(uVar7 >> 4) + cVar6 & 0xfU) + ((char)(uVar33 >> 4) + cVar32 & 0xfU);
    auVar54[1] = ((bVar23 >> 4) + bVar23 & 0xf) + ((bVar55 >> 4) + bVar55 & 0xf);
    auVar54[2] = ((char)(ushort)((uint)uVar8 >> 0x14) + cVar24 & 0xfU) +
                 ((char)(ushort)((uint)uVar34 >> 0x14) + cVar56 & 0xfU);
    auVar54[3] = ((bVar25 >> 4) + bVar25 & 0xf) + ((bVar57 >> 4) + bVar57 & 0xf);
    auVar54[4] = ((char)(ushort)((uint6)uVar9 >> 0x24) + cVar26 & 0xfU) +
                 ((char)(ushort)((uint6)uVar35 >> 0x24) + cVar58 & 0xfU);
    auVar54[5] = ((bVar27 >> 4) + bVar27 & 0xf) + ((bVar59 >> 4) + bVar59 & 0xf);
    auVar54[6] = ((char)(ushort)((ulong)uVar10 >> 0x34) + cVar28 & 0xfU) +
                 ((char)(ushort)((ulong)uVar36 >> 0x34) + cVar60 & 0xfU);
    auVar54[7] = ((bVar29 >> 4) + bVar29 & 0xf) + ((bVar61 >> 4) + bVar61 & 0xf);
    auVar54[8] = ((char)(ushort)((unkuint10)auVar14._0_10_ >> 0x44) + cVar30 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar40._0_10_ >> 0x44) + cVar62 & 0xfU);
    auVar54[9] = ((bVar31 >> 4) + bVar31 & 0xf) + ((bVar63 >> 4) + bVar63 & 0xf);
    auVar54[10] = ((char)(auVar14._10_2_ >> 4) + auVar14[10] & 0xfU) +
                  ((char)(auVar40._10_2_ >> 4) + auVar40[10] & 0xfU);
    auVar54[0xb] = ((auVar14[0xb] >> 4) + auVar14[0xb] & 0xf) +
                   ((auVar40[0xb] >> 4) + auVar40[0xb] & 0xf);
    auVar54[0xc] = ((char)(auVar18._12_2_ >> 4) + auVar18[0xc] & 0xfU) +
                   ((char)(auVar44._12_2_ >> 4) + auVar44[0xc] & 0xfU);
    auVar54[0xd] = ((auVar18[0xd] >> 4) + auVar18[0xd] & 0xf) +
                   ((auVar44[0xd] >> 4) + auVar44[0xd] & 0xf);
    auVar54[0xe] = ((char)(auVar22._14_2_ >> 4) + auVar22[0xe] & 0xfU) +
                   ((char)(auVar52._14_2_ >> 4) + auVar52[0xe] & 0xfU);
    auVar54[0xf] = ((auVar22[0xf] >> 4) + auVar22[0xf] & 0xf) +
                   ((auVar52[0xf] >> 4) + auVar52[0xf] & 0xf);
    auVar77 = psadbw(auVar54,(undefined1  [16])0x0);
    sVar3 = sVar3 + auVar77._8_8_ + auVar77._0_8_;
  }
  for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    uVar5 = bitset->array[uVar4] - (bitset->array[uVar4] >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    sVar3 = sVar3 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  return sVar3;
}

Assistant:

size_t bitset_count(const bitset_t *bitset) {
    size_t card = 0;
    size_t k = 0;
    for (; k + 7 < bitset->arraysize; k += 8) {
        card += roaring_hamming(bitset->array[k]);
        card += roaring_hamming(bitset->array[k + 1]);
        card += roaring_hamming(bitset->array[k + 2]);
        card += roaring_hamming(bitset->array[k + 3]);
        card += roaring_hamming(bitset->array[k + 4]);
        card += roaring_hamming(bitset->array[k + 5]);
        card += roaring_hamming(bitset->array[k + 6]);
        card += roaring_hamming(bitset->array[k + 7]);
    }
    for (; k + 3 < bitset->arraysize; k += 4) {
        card += roaring_hamming(bitset->array[k]);
        card += roaring_hamming(bitset->array[k + 1]);
        card += roaring_hamming(bitset->array[k + 2]);
        card += roaring_hamming(bitset->array[k + 3]);
    }
    for (; k < bitset->arraysize; k++) {
        card += roaring_hamming(bitset->array[k]);
    }
    return card;
}